

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream.c
# Opt level: O0

ngx_int_t ngx_http_upstream_copy_content_encoding
                    (ngx_http_request_t *r,ngx_table_elt_t *h,ngx_uint_t offset)

{
  ngx_table_elt_t *__dest;
  ngx_table_elt_t *ho;
  ngx_uint_t offset_local;
  ngx_table_elt_t *h_local;
  ngx_http_request_t *r_local;
  
  __dest = (ngx_table_elt_t *)ngx_list_push(&(r->headers_out).headers);
  if (__dest == (ngx_table_elt_t *)0x0) {
    r_local = (ngx_http_request_t *)0xffffffffffffffff;
  }
  else {
    memcpy(__dest,h,0x30);
    (r->headers_out).content_encoding = __dest;
    r_local = (ngx_http_request_t *)0x0;
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_upstream_copy_content_encoding(ngx_http_request_t *r,
    ngx_table_elt_t *h, ngx_uint_t offset)
{
    ngx_table_elt_t  *ho;

    ho = ngx_list_push(&r->headers_out.headers);
    if (ho == NULL) {
        return NGX_ERROR;
    }

    *ho = *h;

    r->headers_out.content_encoding = ho;

    return NGX_OK;
}